

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O3

void conversion_operator_suite::run(void)

{
  get_null();
  get_boolean();
  get_integer();
  get_real();
  get_string();
  get_wstring();
  get_u16string();
  get_u32string();
  get_array();
  get_map();
  return;
}

Assistant:

void run()
{
    get_null();
    get_boolean();
    get_integer();
    get_real();
    get_string();
    get_wstring();
    get_u16string();
    get_u32string();
    get_array();
    get_map();
}